

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::verifyBoolean
               (ResultCollector *result,QueriedState *state,bool expected)

{
  ostream *poVar1;
  ostringstream buf;
  string local_1d8;
  float local_1b4;
  Enum<int,_1UL> local_1b0;
  ostringstream local_1a0 [376];
  
  switch(state->m_type) {
  case DATATYPE_BOOLEAN:
    if ((state->m_v).vBool == expected) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Expected ");
    local_1d8._M_dataplus._M_p = (pointer)glu::getBooleanName;
    local_1d8._M_string_length._0_4_ = (uint)expected;
    poVar1 = tcu::Format::Enum<int,_1UL>::toStream((Enum<int,_1UL> *)&local_1d8,poVar1);
    poVar1 = std::operator<<(poVar1,", got ");
    local_1b0.m_getName = glu::getBooleanName;
    local_1b0.m_value = (int)(state->m_v).vBool;
    tcu::Format::Enum<int,_1UL>::toStream(&local_1b0,poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  case DATATYPE_INTEGER:
    if ((state->m_v).vInt == (uint)expected) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Expected ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)expected);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::operator<<(poVar1,(state->m_v).vInt);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  case DATATYPE_INTEGER64:
    if ((state->m_v).vInt64 == (ulong)expected) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Expected ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::_M_insert<long>((long)poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  case DATATYPE_FLOAT:
    if (expected) {
      local_1b4 = 1.0;
    }
    else {
      local_1b4 = 0.0;
    }
    if (((state->m_v).vFloat == local_1b4) && (!NAN((state->m_v).vFloat) && !NAN(local_1b4))) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Expected ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b4);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::operator<<(poVar1,(state->m_v).vFloat);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  default:
    goto switchD_014d55de_default;
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
switchD_014d55de_default:
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}